

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderAlgorithmTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderAlgorithmTests::init(ShaderAlgorithmTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  LineStream *pLVar2;
  TestNode *pTVar3;
  LineStream LStack_1b8;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::LineStream::LineStream(&LStack_1b8,1);
  pLVar2 = deqp::gls::LineStream::operator<<
                     (&LStack_1b8,"mediump float H = coords.x, S = coords.y, L = coords.z;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"mediump float v = (L <= 0.5) ? (L * (1.0 + S)) : (L + S - L * S);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"res = vec3(L); // default to gray");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"if (v > 0.0)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float m = L + L - v;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float sv = (v - m) / v;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tH *= 6.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int sextant = int(H);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float fract = H - float(sextant);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float vsf = v * sv * fract;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float mid1 = m + vsf;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float mid2 = m - vsf;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tif (sextant == 0)      res = vec3(v, mid1, m);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 1) res = vec3(mid2, v, m);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 2) res = vec3(m, v, mid1);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 3) res = vec3(m, mid2, v);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 4) res = vec3(mid1, m, v);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse                   res = vec3(v, m, mid2);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pTVar3 = (TestNode *)
           createExpressionCase
                     (pCVar1,"hsl_to_rgb_vertex","Conversion from HSL color space into RGB.",true,
                      init()::Eval_hsl_to_rgb::eval(deqp::gls::ShaderEvalContext__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  deqp::gls::LineStream::~LineStream(&LStack_1b8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::LineStream::LineStream(&LStack_1b8,1);
  pLVar2 = deqp::gls::LineStream::operator<<
                     (&LStack_1b8,"mediump float H = coords.x, S = coords.y, L = coords.z;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"mediump float v = (L <= 0.5) ? (L * (1.0 + S)) : (L + S - L * S);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"res = vec3(L); // default to gray");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"if (v > 0.0)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float m = L + L - v;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float sv = (v - m) / v;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tH *= 6.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump int sextant = int(H);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float fract = H - float(sextant);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float vsf = v * sv * fract;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float mid1 = m + vsf;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float mid2 = m - vsf;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tif (sextant == 0)      res = vec3(v, mid1, m);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 1) res = vec3(mid2, v, m);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 2) res = vec3(m, v, mid1);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 3) res = vec3(m, mid2, v);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (sextant == 4) res = vec3(mid1, m, v);");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse                   res = vec3(v, m, mid2);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pTVar3 = (TestNode *)
           createExpressionCase
                     (pCVar1,"hsl_to_rgb_fragment","Conversion from HSL color space into RGB.",false
                      ,init()::Eval_hsl_to_rgb::eval(deqp::gls::ShaderEvalContext__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  deqp::gls::LineStream::~LineStream(&LStack_1b8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::LineStream::LineStream(&LStack_1b8,1);
  pLVar2 = deqp::gls::LineStream::operator<<
                     (&LStack_1b8,"mediump float r = coords.x, g = coords.y, b = coords.z;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float minVal = min(min(r, g), b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float maxVal = max(max(r, g), b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float L = (minVal + maxVal) * 0.5;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"if (minVal == maxVal)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tres = vec3(0.0, 0.0, L);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"else");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float H;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float S;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (L < 0.5)");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t\tS = (maxVal - minVal) / (maxVal + minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\telse");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t\tS = (maxVal - minVal) / (2.0 - maxVal - minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tmediump float ooDiff = 1.0 / (maxVal - minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (r == maxVal)      H = (g - b) * ooDiff;")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (g == maxVal) H = 2.0 + (b - r) * ooDiff;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse                  H = 4.0 + (r - g) * ooDiff;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tH /= 6.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tres = vec3(H, S, L);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pTVar3 = (TestNode *)
           createExpressionCase
                     (pCVar1,"rgb_to_hsl_vertex","Conversion from RGB color space into HSL.",true,
                      init()::Eval_rgb_to_hsl::eval(deqp::gls::ShaderEvalContext__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  deqp::gls::LineStream::~LineStream(&LStack_1b8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  deqp::gls::LineStream::LineStream(&LStack_1b8,1);
  pLVar2 = deqp::gls::LineStream::operator<<
                     (&LStack_1b8,"mediump float r = coords.x, g = coords.y, b = coords.z;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float minVal = min(min(r, g), b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float maxVal = max(max(r, g), b);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"mediump float L = (minVal + maxVal) * 0.5;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"if (minVal == maxVal)");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tres = vec3(0.0, 0.0, L);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"else");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"{");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float H;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tmediump float S;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (L < 0.5)");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t\tS = (maxVal - minVal) / (maxVal + minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\telse");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\t\tS = (maxVal - minVal) / (2.0 - maxVal - minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\tmediump float ooDiff = 1.0 / (maxVal - minVal);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tif (r == maxVal)      H = (g - b) * ooDiff;")
  ;
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse if (g == maxVal) H = 2.0 + (b - r) * ooDiff;");
  pLVar2 = deqp::gls::LineStream::operator<<
                     (pLVar2,"\telse                  H = 4.0 + (r - g) * ooDiff;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tH /= 6.0;");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"\tres = vec3(H, S, L);");
  pLVar2 = deqp::gls::LineStream::operator<<(pLVar2,"}");
  pTVar3 = (TestNode *)
           createExpressionCase
                     (pCVar1,"rgb_to_hsl_fragment","Conversion from RGB color space into HSL.",false
                      ,init()::Eval_rgb_to_hsl::eval(deqp::gls::ShaderEvalContext__,pLVar2);
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  deqp::gls::LineStream::~LineStream(&LStack_1b8);
  return extraout_EAX;
}

Assistant:

void ShaderAlgorithmTests::init (void)
{
//	TestCaseGroup* colorGroup = new TestCaseGroup(m_testCtx, "color", "Miscellaneous color related algorithm tests.");
//	addChild(colorGroup);

	#define SHADER_OP_CASE(NAME, DESCRIPTION, SHADER_OP, EVAL_FUNC_BODY)														\
		do {																													\
			struct Eval_##NAME { static void eval (ShaderEvalContext& c) EVAL_FUNC_BODY };	/* NOLINT(EVAL_FUNC_BODY) */		\
			addChild(createExpressionCase(m_context, #NAME "_vertex", DESCRIPTION, true, &Eval_##NAME::eval, SHADER_OP));		\
			addChild(createExpressionCase(m_context, #NAME "_fragment", DESCRIPTION, false, &Eval_##NAME::eval, SHADER_OP));	\
		} while (deGetFalse())

	SHADER_OP_CASE(hsl_to_rgb, "Conversion from HSL color space into RGB.",
		LineStream(1)
		<< "mediump float H = coords.x, S = coords.y, L = coords.z;"
		<< "mediump float v = (L <= 0.5) ? (L * (1.0 + S)) : (L + S - L * S);"
		<< "res = vec3(L); // default to gray"
		<< "if (v > 0.0)"
		<< "{"
		<< "	mediump float m = L + L - v;"
		<< "	mediump float sv = (v - m) / v;"
		<< "	H *= 6.0;"
		<< "	mediump int sextant = int(H);"
		<< "	mediump float fract = H - float(sextant);"
		<< "	mediump float vsf = v * sv * fract;"
		<< "	mediump float mid1 = m + vsf;"
		<< "	mediump float mid2 = m - vsf;"
		<< "	if (sextant == 0)      res = vec3(v, mid1, m);"
		<< "	else if (sextant == 1) res = vec3(mid2, v, m);"
		<< "	else if (sextant == 2) res = vec3(m, v, mid1);"
		<< "	else if (sextant == 3) res = vec3(m, mid2, v);"
		<< "	else if (sextant == 4) res = vec3(mid1, m, v);"
		<< "	else                   res = vec3(v, m, mid2);"
		<< "}",
		{
			float H = c.unitCoords.x();
			float S = c.unitCoords.y();
			float L = c.unitCoords.z();
			Vec3 rgb = Vec3(L);
			float v = (L <= 0.5f) ? (L * (1.0f + S)) : (L + S - L * S);
			if (v > 0.0f)
			{
				float m = L + L - v;
				float sv = (v - m) / v;
				H *= 6.0f;
				int sextant = int(H);
				float fract = H - float(sextant);
				float vsf = v * sv * fract;
				float mid1 = m + vsf;
				float mid2 = m - vsf;
				if (sextant == 0)		rgb = Vec3(v, mid1, m);
				else if (sextant == 1)	rgb = Vec3(mid2, v, m);
				else if (sextant == 2)	rgb = Vec3(m, v, mid1);
				else if (sextant == 3)	rgb = Vec3(m, mid2, v);
				else if (sextant == 4)	rgb = Vec3(mid1, m, v);
				else					rgb = Vec3(v, m, mid2);
			}
			c.color.xyz() = rgb;
		});

	SHADER_OP_CASE(rgb_to_hsl, "Conversion from RGB color space into HSL.",
		LineStream(1)
		<< "mediump float r = coords.x, g = coords.y, b = coords.z;"
		<< "mediump float minVal = min(min(r, g), b);"
		<< "mediump float maxVal = max(max(r, g), b);"
		<< "mediump float L = (minVal + maxVal) * 0.5;"
		<< "if (minVal == maxVal)"
		<< "	res = vec3(0.0, 0.0, L);"
		<< "else"
		<< "{"
		<< "	mediump float H;"
		<< "	mediump float S;"
		<< "	if (L < 0.5)"
		<< "		S = (maxVal - minVal) / (maxVal + minVal);"
		<< "	else"
		<< "		S = (maxVal - minVal) / (2.0 - maxVal - minVal);"
		<< ""
		<< "	mediump float ooDiff = 1.0 / (maxVal - minVal);"
		<< "	if (r == maxVal)      H = (g - b) * ooDiff;"
		<< "	else if (g == maxVal) H = 2.0 + (b - r) * ooDiff;"
		<< "	else                  H = 4.0 + (r - g) * ooDiff;"
		<< "	H /= 6.0;"
		<< ""
		<< "	res = vec3(H, S, L);"
		<< "}",
		{
			float r = c.unitCoords.x();
			float g = c.unitCoords.y();
			float b = c.unitCoords.z();
			float minVal = min(min(r, g), b);
			float maxVal = max(max(r, g), b);
			float L = (minVal + maxVal) * 0.5f;
			Vec3 hsl;

			if (minVal == maxVal)
				hsl = Vec3(0.0f, 0.0f, L);
			else
			{
				float H;
				float S;
				if (L < 0.5f)
					S = (maxVal - minVal) / (maxVal + minVal);
				else
					S = (maxVal - minVal) / (2.0f - maxVal - minVal);

				float ooDiff = 1.0f / (maxVal - minVal);
				if (r == maxVal)		H = (g - b) * ooDiff;
				else if (g == maxVal)	H = 2.0f + (b - r) * ooDiff;
				else					H = 4.0f + (r - g) * ooDiff;
				H /= 6.0f;

				hsl = Vec3(H, S, L);
			}
			c.color.xyz() = hsl;
		});

/*	SHADER_OP_CASE(image_to_grayscale, "Convert image to grayscale.",
		LineStream(1)
		<< "res = texture2D(ut_brick, coords.xy).rgb;",
		{
			c.color.xyz() = Vec3(0.5f);
		});*/
}